

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

wchar_t * ON_Font::DefaultWindowsLogfontName(void)

{
  wchar_t *s;
  
  return L"Arial";
}

Assistant:

const wchar_t* ON_Font::DefaultWindowsLogfontName()
{
  const wchar_t* s;
#if defined(ON_RUNTIME_WIN)
  s = L"Arial";
#elif defined(ON_RUNTIME_APPLE)
  s = L"Helvetica Neue";
#else
  s = L"Arial";
#endif
  return s;
}